

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

size_t nhdp_domain_encode_willingness_tlvvalue(uint8_t *tlvvalue,size_t tlvsize)

{
  uint uVar1;
  byte bVar2;
  list_entity *plVar3;
  ulong uVar4;
  ulong uVar5;
  
  memset(tlvvalue,0,tlvsize);
  *tlvvalue = _flooding_domain.local_willingness;
  if (((&log_global_mask)[LOG_NHDP_W] & 1) != 0) {
    oonf_log(1,(ulong)LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x346,0,0,
             "Set flooding willingness: %u",_flooding_domain.local_willingness);
  }
  if ((_domain_list.next)->prev == _domain_list.prev) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    plVar3 = _domain_list.next;
    do {
      uVar1 = *(uint *)((long)&plVar3[-0x27].next + 4);
      uVar4 = (ulong)((int)((uVar1 - ((int)(uVar1 + 1) >> 0x1f)) + 1) >> 1);
      if (tlvsize <= uVar4) {
        return 0xffffffffffffffff;
      }
      if (uVar5 < uVar4 + 1) {
        uVar5 = uVar4 + 1;
      }
      bVar2 = *(byte *)&plVar3[-0x27].next & 0xf;
      if ((uVar1 & 1) == 0) {
        bVar2 = *(byte *)&plVar3[-0x27].next << 4;
      }
      if (((&log_global_mask)[LOG_NHDP_W] & 1) != 0) {
        oonf_log(1,(ulong)LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x35b,0,0,
                 "Set routing willingness for domain %u: %x (%zu)",
                 *(undefined1 *)((long)&plVar3[-0x27].next + 1),bVar2,uVar4);
      }
      tlvvalue[uVar4] = tlvvalue[uVar4] | bVar2;
      plVar3 = plVar3->next;
    } while (plVar3->prev != _domain_list.prev);
  }
  return uVar5;
}

Assistant:

size_t
nhdp_domain_encode_willingness_tlvvalue(uint8_t *tlvvalue, size_t tlvsize) {
  struct nhdp_domain *domain;
  uint8_t value;
  size_t idx, len;

  memset(tlvvalue, 0, tlvsize);
  len = 0;

  /* set flooding willingness */
  tlvvalue[0] = _flooding_domain.local_willingness;
  OONF_DEBUG(LOG_NHDP_W, "Set flooding willingness: %u", _flooding_domain.local_willingness);

  /* set routing willingness */
  list_for_each_element(&_domain_list, domain, _node) {
    idx = (domain->index + 1) / 2;
    if (idx >= tlvsize) {
      return -1;
    }
    if (idx + 1 > len) {
      len = idx + 1;
    }

    value = domain->local_willingness & RFC7181_WILLINGNESS_MASK;

    if ((domain->index & 1) == 0) {
      value <<= RFC7181_WILLINGNESS_SHIFT;
    }

    OONF_DEBUG(LOG_NHDP_W,
      "Set routing willingness for domain %u: %x"
      " (%" PRINTF_SIZE_T_SPECIFIER ")",
      domain->ext, value, idx);

    tlvvalue[idx] |= value;
  }

  return len;
}